

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O3

uint aom_highbd_sad16x8_avg_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 (*pauVar3) [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 (*pauVar8) [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  pauVar8 = (undefined1 (*) [32])((long)second_pred * 2);
  puVar1 = (undefined8 *)((long)src * 2);
  local_140 = *puVar1;
  uStack_138 = puVar1[1];
  uStack_130 = puVar1[2];
  uStack_128 = puVar1[3];
  puVar1 = (undefined8 *)((long)src_stride * 2 + (long)src * 2);
  local_120 = *puVar1;
  uStack_118 = puVar1[1];
  uStack_110 = puVar1[2];
  uStack_108 = puVar1[3];
  puVar1 = (undefined8 *)((long)(src_stride * 2) * 2 + (long)src * 2);
  local_100 = *puVar1;
  uStack_f8 = puVar1[1];
  uStack_f0 = puVar1[2];
  uStack_e8 = puVar1[3];
  puVar1 = (undefined8 *)((long)(src_stride * 3) * 2 + (long)src * 2);
  local_e0 = *puVar1;
  uStack_d8 = puVar1[1];
  uStack_d0 = puVar1[2];
  uStack_c8 = puVar1[3];
  local_c0 = *(undefined1 (*) [32])((long)ref * 2);
  local_a0 = *(undefined1 (*) [32])((long)ref_stride * 2 + (long)ref * 2);
  local_80 = *(undefined1 (*) [32])((long)(ref_stride * 2) * 2 + (long)ref * 2);
  local_60 = *(undefined1 (*) [32])((long)(ref_stride * 3) * 2 + (long)ref * 2);
  if (pauVar8 != (undefined1 (*) [32])0x0) {
    local_c0 = vpavgw_avx2(*(undefined1 (*) [32])((long)ref * 2),*pauVar8);
    local_a0 = vpavgw_avx2(local_a0,pauVar8[1]);
    local_80 = vpavgw_avx2(local_80,pauVar8[2]);
    local_60 = vpavgw_avx2(local_60,pauVar8[3]);
  }
  lVar12 = 0;
  do {
    auVar5 = vpsubw_avx2(*(undefined1 (*) [32])((long)&local_140 + lVar12),
                         *(undefined1 (*) [32])(local_c0 + lVar12));
    auVar5 = vpabsw_avx2(auVar5);
    *(undefined1 (*) [32])((long)&local_140 + lVar12) = auVar5;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x80);
  auVar5._8_8_ = uStack_138;
  auVar5._0_8_ = local_140;
  auVar5._16_8_ = uStack_130;
  auVar5._24_8_ = uStack_128;
  auVar14._8_8_ = uStack_118;
  auVar14._0_8_ = local_120;
  auVar14._16_8_ = uStack_110;
  auVar14._24_8_ = uStack_108;
  auVar7._8_8_ = uStack_f8;
  auVar7._0_8_ = local_100;
  auVar7._16_8_ = uStack_f0;
  auVar7._24_8_ = uStack_e8;
  auVar13._8_8_ = uStack_d8;
  auVar13._0_8_ = local_e0;
  auVar13._16_8_ = uStack_d0;
  auVar13._24_8_ = uStack_c8;
  puVar2 = (undefined8 *)((long)src * 2 + (long)(src_stride * 4) * 2);
  pauVar3 = (undefined1 (*) [32])((long)ref * 2 + (long)(ref_stride * 4) * 2);
  local_140 = *puVar2;
  uStack_138 = puVar2[1];
  uStack_130 = puVar2[2];
  uStack_128 = puVar2[3];
  puVar1 = (undefined8 *)((long)puVar2 + (long)src_stride * 2);
  local_120 = *puVar1;
  uStack_118 = puVar1[1];
  uStack_110 = puVar1[2];
  uStack_108 = puVar1[3];
  puVar1 = (undefined8 *)((long)puVar2 + (long)(src_stride * 2) * 2);
  local_100 = *puVar1;
  uStack_f8 = puVar1[1];
  uStack_f0 = puVar1[2];
  uStack_e8 = puVar1[3];
  puVar2 = (undefined8 *)((long)puVar2 + (long)(src_stride * 3) * 2);
  local_e0 = *puVar2;
  uStack_d8 = puVar2[1];
  uStack_d0 = puVar2[2];
  uStack_c8 = puVar2[3];
  local_c0 = vpavgw_avx2(*pauVar3,pauVar8[4]);
  local_a0 = vpavgw_avx2(*(undefined1 (*) [32])(*pauVar3 + (long)ref_stride * 2),pauVar8[5]);
  local_80 = vpavgw_avx2(*(undefined1 (*) [32])(*pauVar3 + (long)(ref_stride * 2) * 2),pauVar8[6]);
  local_60 = vpavgw_avx2(*(undefined1 (*) [32])(*pauVar3 + (long)(ref_stride * 3) * 2),pauVar8[7]);
  lVar12 = 0;
  do {
    auVar6 = vpsubw_avx2(*(undefined1 (*) [32])((long)&local_140 + lVar12),
                         *(undefined1 (*) [32])(local_c0 + lVar12));
    auVar6 = vpabsw_avx2(auVar6);
    *(undefined1 (*) [32])((long)&local_140 + lVar12) = auVar6;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x80);
  auVar5 = vpaddw_avx2(auVar14,auVar5);
  auVar5 = vpaddw_avx2(auVar5,auVar7);
  auVar5 = vpaddw_avx2(auVar5,auVar13);
  auVar13 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar14 = vpunpckhwd_avx2(auVar5,auVar13);
  auVar7 = vpunpcklwd_avx2(auVar5,auVar13);
  auVar9._8_8_ = uStack_118;
  auVar9._0_8_ = local_120;
  auVar9._16_8_ = uStack_110;
  auVar9._24_8_ = uStack_108;
  auVar6._8_8_ = uStack_138;
  auVar6._0_8_ = local_140;
  auVar6._16_8_ = uStack_130;
  auVar6._24_8_ = uStack_128;
  auVar5 = vpaddw_avx2(auVar9,auVar6);
  auVar10._8_8_ = uStack_f8;
  auVar10._0_8_ = local_100;
  auVar10._16_8_ = uStack_f0;
  auVar10._24_8_ = uStack_e8;
  auVar5 = vpaddw_avx2(auVar5,auVar10);
  auVar11._8_8_ = uStack_d8;
  auVar11._0_8_ = local_e0;
  auVar11._16_8_ = uStack_d0;
  auVar11._24_8_ = uStack_c8;
  auVar5 = vpaddw_avx2(auVar5,auVar11);
  auVar14 = vpaddd_avx2(auVar14,auVar7);
  auVar7 = vpunpcklwd_avx2(auVar5,auVar13);
  auVar14 = vpaddd_avx2(auVar14,auVar7);
  auVar5 = vpunpckhwd_avx2(auVar5,auVar13);
  auVar5 = vpaddd_avx2(auVar14,auVar5);
  auVar14 = vpsrldq_avx2(auVar5,8);
  auVar5 = vpaddd_avx2(auVar5,auVar14);
  auVar4 = vpaddd_avx(auVar5._16_16_,auVar5._0_16_);
  auVar4 = vphaddd_avx(auVar4,auVar4);
  return auVar4._0_4_;
}

Assistant:

unsigned int aom_highbd_sad16x8_avg_avx2(const uint8_t *src, int src_stride,
                                         const uint8_t *ref, int ref_stride,
                                         const uint8_t *second_pred) {
  __m256i sad = _mm256_setzero_si256();
  uint16_t *srcp = CONVERT_TO_SHORTPTR(src);
  uint16_t *refp = CONVERT_TO_SHORTPTR(ref);
  uint16_t *secp = CONVERT_TO_SHORTPTR(second_pred);

  sad16x4(srcp, src_stride, refp, ref_stride, secp, &sad);

  // Next 4 rows
  srcp += src_stride << 2;
  refp += ref_stride << 2;
  secp += 64;
  sad16x4(srcp, src_stride, refp, ref_stride, secp, &sad);
  return get_sad_from_mm256_epi32(&sad);
}